

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O3

double __thiscall
chrono::ChFunction::Compute_int
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar2 = xmin;
  (*this->_vptr_ChFunction[10])();
  auVar5 = ZEXT816(0) << 0x40;
  dVar1 = sampling_step + xmin;
  while (dVar1 <= xmax) {
    dVar3 = dVar1;
    (*this->_vptr_ChFunction[10])(this,derivate);
    auVar5._8_8_ = 0;
    dVar1 = dVar1 + sampling_step;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (dVar3 + dVar2) * sampling_step;
    auVar5 = vfmadd231sd_fma(auVar5,auVar4,ZEXT816(0x3fe0000000000000));
    dVar2 = dVar3;
  }
  return auVar5._0_8_;
}

Assistant:

double ChFunction::Compute_int(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = 0;
    double ya = this->Get_y_dN(xmin, derivate);
    double yb = 0;
    for (double mx = xmin + sampling_step; mx <= xmax; mx += sampling_step) {
        yb = this->Get_y_dN(mx, derivate);
        mret += sampling_step * (ya + yb) * 0.5;  // trapezoidal quadrature
        ya = yb;
    }
    return mret;
}